

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_c.h
# Opt level: O2

int MPIABI_Status_f2c(MPIABI_Fint *f_status,MPIABI_Status *c_status)

{
  int iVar1;
  WPI_StatusPtr local_10;
  
  local_10.wrapped_status_ptr = (WPI_Status *)c_status;
  iVar1 = MPI_Status_f2c();
  WPI_StatusPtr::~WPI_StatusPtr(&local_10);
  return iVar1;
}

Assistant:

int MPIABI_Status_f2c(
  const MPIABI_Fint * f_status,
  MPIABI_Status * c_status
) {
  return MPI_Status_f2c(
    (const MPI_Fint *)(const WPI_Fint *)f_status,
    (MPI_Status *)(WPI_StatusPtr)c_status
  );
}